

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

int xstcTestInstance(xmlNodePtr cur,xmlSchemaPtr schemas,xmlChar *spath,char *base)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  undefined8 uVar5;
  int local_54;
  int mem;
  int ret;
  xmlDocPtr doc;
  xmlSchemaValidCtxtPtr ctxt;
  xmlChar *validity;
  xmlChar *path;
  xmlChar *href;
  char *base_local;
  xmlChar *spath_local;
  xmlSchemaPtr schemas_local;
  xmlNodePtr cur_local;
  
  validity = (xmlChar *)0x0;
  ctxt = (xmlSchemaValidCtxtPtr)0x0;
  doc = (xmlDocPtr)0x0;
  _mem = 0;
  xmlResetLastError();
  testErrorsSize = 0;
  testErrors[0] = '\0';
  iVar2 = xmlMemUsed();
  pxVar4 = getString(cur,"string(ts:instanceDocument/@xlink:href)");
  if ((pxVar4 == (xmlChar *)0x0) || (*pxVar4 == '\0')) {
    uVar5 = xmlGetLineNo(cur);
    test_log("testGroup line %ld misses href for schemaDocument\n",uVar5);
    local_54 = -1;
  }
  else {
    validity = (xmlChar *)xmlBuildURI(pxVar4,base);
    pFVar1 = _stderr;
    if (validity == (xmlChar *)0x0) {
      uVar5 = xmlGetLineNo(cur);
      fprintf(pFVar1,"Failed to build path to schemas testGroup line %ld : %s\n",uVar5,pxVar4);
      local_54 = -1;
    }
    else {
      iVar3 = checkTestFile((char *)validity);
      if (iVar3 < 1) {
        uVar5 = xmlGetLineNo(cur);
        test_log("schemas for testGroup line %ld is missing: %s\n",uVar5,validity);
        local_54 = -1;
      }
      else {
        ctxt = (xmlSchemaValidCtxtPtr)getString(cur,"string(ts:expected/@validity)");
        pFVar1 = _stderr;
        if (ctxt == (xmlSchemaValidCtxtPtr)0x0) {
          uVar5 = xmlGetLineNo(cur);
          fprintf(pFVar1,"instanceDocument line %ld misses expected validity\n",uVar5);
          local_54 = -1;
        }
        else {
          nb_tests = nb_tests + 1;
          _mem = xmlReadFile(validity,0,2);
          if (_mem == 0) {
            fprintf(_stderr,"instance %s fails to parse\n",validity);
            local_54 = -1;
            nb_errors = nb_errors + 1;
          }
          else {
            doc = (xmlDocPtr)xmlSchemaNewValidCtxt(schemas);
            xmlSchemaSetValidErrors(doc,testErrorHandler,testErrorHandler,doc);
            local_54 = xmlSchemaValidateDoc(doc,_mem);
            iVar3 = xmlStrEqual(ctxt,"valid");
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(ctxt,"invalid");
              if (iVar3 == 0) {
                uVar5 = xmlGetLineNo(cur);
                test_log("instanceDocument line %ld has unexpected validity value%s\n",uVar5,ctxt);
                local_54 = -1;
              }
              else if (local_54 == 0) {
                test_log("Failed to detect invalid instance %s against %s\n",validity,spath);
                nb_errors = nb_errors + 1;
              }
            }
            else if (local_54 < 1) {
              if (local_54 < 0) {
                test_log("valid instance %s got internal error validating %s\n",validity,spath);
                nb_internals = nb_internals + 1;
                nb_errors = nb_errors + 1;
              }
            }
            else {
              test_log("valid instance %s failed to validate against %s\n",validity,spath);
              nb_errors = nb_errors + 1;
            }
          }
        }
      }
    }
  }
  if (pxVar4 != (xmlChar *)0x0) {
    (*_xmlFree)(pxVar4);
  }
  if (validity != (xmlChar *)0x0) {
    (*_xmlFree)(validity);
  }
  if (ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    (*_xmlFree)(ctxt);
  }
  if (doc != (xmlDocPtr)0x0) {
    xmlSchemaFreeValidCtxt(doc);
  }
  if (_mem != 0) {
    xmlFreeDoc(_mem);
  }
  xmlResetLastError();
  iVar3 = xmlMemUsed();
  if (iVar2 != iVar3) {
    uVar5 = xmlGetLineNo(cur);
    iVar3 = xmlMemUsed();
    test_log("Validation of tests starting line %ld leaked %d\n",uVar5,(ulong)(uint)(iVar3 - iVar2))
    ;
    nb_leaks = nb_leaks + 1;
  }
  return local_54;
}

Assistant:

static int
xstcTestInstance(xmlNodePtr cur, xmlSchemaPtr schemas,
                 const xmlChar *spath, const char *base) {
    xmlChar *href = NULL;
    xmlChar *path = NULL;
    xmlChar *validity = NULL;
    xmlSchemaValidCtxtPtr ctxt = NULL;
    xmlDocPtr doc = NULL;
    int ret = 0, mem;

    xmlResetLastError();
    testErrorsSize = 0; testErrors[0] = 0;
    mem = xmlMemUsed();
    href = getString(cur,
                     "string(ts:instanceDocument/@xlink:href)");
    if ((href == NULL) || (href[0] == 0)) {
	test_log("testGroup line %ld misses href for schemaDocument\n",
		    xmlGetLineNo(cur));
	ret = -1;
	goto done;
    }
    path = xmlBuildURI(href, BAD_CAST base);
    if (path == NULL) {
	fprintf(stderr,
	        "Failed to build path to schemas testGroup line %ld : %s\n",
		xmlGetLineNo(cur), href);
	ret = -1;
	goto done;
    }
    if (checkTestFile((const char *) path) <= 0) {
	test_log("schemas for testGroup line %ld is missing: %s\n",
		xmlGetLineNo(cur), path);
	ret = -1;
	goto done;
    }
    validity = getString(cur,
                         "string(ts:expected/@validity)");
    if (validity == NULL) {
        fprintf(stderr, "instanceDocument line %ld misses expected validity\n",
	        xmlGetLineNo(cur));
	ret = -1;
	goto done;
    }
    nb_tests++;
    doc = xmlReadFile((const char *) path, NULL, XML_PARSE_NOENT);
    if (doc == NULL) {
        fprintf(stderr, "instance %s fails to parse\n", path);
	ret = -1;
	nb_errors++;
	goto done;
    }

    ctxt = xmlSchemaNewValidCtxt(schemas);
    xmlSchemaSetValidErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    ret = xmlSchemaValidateDoc(ctxt, doc);

    if (xmlStrEqual(validity, BAD_CAST "valid")) {
	if (ret > 0) {
	    test_log("valid instance %s failed to validate against %s\n",
			path, spath);
	    nb_errors++;
	} else if (ret < 0) {
	    test_log("valid instance %s got internal error validating %s\n",
			path, spath);
	    nb_internals++;
	    nb_errors++;
	}
    } else if (xmlStrEqual(validity, BAD_CAST "invalid")) {
	if (ret == 0) {
	    test_log("Failed to detect invalid instance %s against %s\n",
			path, spath);
	    nb_errors++;
	}
    } else {
        test_log("instanceDocument line %ld has unexpected validity value%s\n",
	        xmlGetLineNo(cur), validity);
	ret = -1;
	goto done;
    }

done:
    if (href != NULL) xmlFree(href);
    if (path != NULL) xmlFree(path);
    if (validity != NULL) xmlFree(validity);
    if (ctxt != NULL) xmlSchemaFreeValidCtxt(ctxt);
    if (doc != NULL) xmlFreeDoc(doc);
    xmlResetLastError();
    if (mem != xmlMemUsed()) {
	test_log("Validation of tests starting line %ld leaked %d\n",
		xmlGetLineNo(cur), xmlMemUsed() - mem);
	nb_leaks++;
    }
    return(ret);
}